

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O2

void __thiscall leveldb::VersionEdit::SetComparatorName(VersionEdit *this,Slice *name)

{
  string local_30;
  
  this->has_comparator_ = true;
  Slice::ToString_abi_cxx11_(&local_30,name);
  std::__cxx11::string::operator=((string *)this,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void SetComparatorName(const Slice& name) {
    has_comparator_ = true;
    comparator_ = name.ToString();
  }